

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferOperationsViaTransformFeedback::initializeBufferObjectData
          (TextureBufferOperationsViaTransformFeedback *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLint GVar5;
  uint uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  char *this_01;
  vector<int,_std::allocator<int>_> data;
  string fsSource;
  string vsSource;
  char *vsCode;
  char *fsCode;
  char *varyings [1];
  long lVar7;
  
  iVar2 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,(ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture
                                << 2),(allocator_type *)&fsSource);
  (*(this->super_TextureBufferOperations).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])
            (this,data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start,
             (ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2)
            );
  (**(code **)(lVar7 + 0x708))(1,&this->m_tf_vao_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error generating vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x486);
  (**(code **)(lVar7 + 0xd8))(this->m_tf_vao_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x489);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_tf_vbo_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error generating vertex buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x48d);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_tf_vbo_id);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error binding vertex buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x490);
  (**(code **)(lVar7 + 0x150))
            (0x8892,(ulong)(uint)((this->super_TextureBufferOperations).
                                  m_n_vectors_in_buffer_texture << 2) << 2,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,0x88e8);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x494);
  GVar4 = (**(code **)(lVar7 + 0x3c8))();
  this->m_tf_po_id = GVar4;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x497);
  varyings[0] = "outPosition";
  (**(code **)(lVar7 + 0x14c8))(this->m_tf_po_id,1,varyings,0x8c8d);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error specifying transform feedback varyings!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x49c);
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->m_tf_fs_id = GVar4;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error creating fragment shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x49f);
  GVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  this->m_tf_vs_id = GVar4;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  this_01 = "Error creating vertex shader object!";
  glu::checkError(dVar3,"Error creating vertex shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x4a2);
  getTFFragmentShaderCode_abi_cxx11_
            (&fsSource,(TextureBufferOperationsViaTransformFeedback *)this_01);
  getTFVertexShaderCode_abi_cxx11_(&vsSource,(TextureBufferOperationsViaTransformFeedback *)this_01)
  ;
  fsCode = fsSource._M_dataplus._M_p;
  vsCode = vsSource._M_dataplus._M_p;
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,this->m_tf_po_id,this->m_tf_fs_id,1,&fsCode,
                     this->m_tf_vs_id,1,&vsCode,(bool *)0x0);
  if (bVar1) {
    (**(code **)(lVar7 + 0x1680))(this->m_tf_po_id);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error setting active program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b0);
    GVar5 = (**(code **)(lVar7 + 0x780))(this->m_tf_po_id,"inPosition");
    this->m_position_location = GVar5;
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error getting attrib location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b3);
    (**(code **)(lVar7 + 0x1958))(this->m_position_location,4,0x1404,0,0);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error setting vertex attrib pointer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b6);
    (**(code **)(lVar7 + 0x610))(this->m_position_location);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error enabling vertex attrib array!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b9);
    (**(code **)(lVar7 + 0x48))(0x8c8e,0,(this->super_TextureBufferOperations).m_tb_bo_id);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error binding buffer object to transform feedback binding point!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4bc);
    (**(code **)(lVar7 + 0x30))(0);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error starting transform feedback!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4bf);
    (**(code **)(lVar7 + 0x538))
              (0,0,(this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture);
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error during rendering!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4c3);
    (**(code **)(lVar7 + 0x638))();
    dVar3 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar3,"Error ending transform feedback!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4c6);
    (**(code **)(lVar7 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar7 + 0x40))(0x8892,0);
    (**(code **)(lVar7 + 0xd8))(0);
    uVar6 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
              _vptr_RenderContext[2])();
    if ((uVar6 & 0x300) == 0) {
      (**(code **)(lVar7 + 0x518))(this->m_position_location);
    }
    (**(code **)(lVar7 + 0x1680))(0);
    this->m_position_location = -1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vsSource._M_dataplus._M_p != &vsSource.field_2) {
      operator_delete(vsSource._M_dataplus._M_p,vsSource.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fsSource._M_dataplus._M_p != &fsSource.field_2) {
      operator_delete(fsSource._M_dataplus._M_p,fsSource.field_2._M_allocated_capacity + 1);
    }
    if (data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not create a program from valid vertex/fragment shader code!",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
             ,0x4ac);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferOperationsViaTransformFeedback::initializeBufferObjectData()
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::vector<glw::GLint> data(m_n_vectors_in_buffer_texture * m_n_vector_components);
	fillBufferWithData(&data[0], m_n_vectors_in_buffer_texture * m_n_vector_components);

	/* Configure vertex array object */
	gl.genVertexArrays(1, &m_tf_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating vertex array object!");

	gl.bindVertexArray(m_tf_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Configure buffer object*/
	gl.genBuffers(1, &m_tf_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating vertex buffer object!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex buffer object!");

	gl.bufferData(GL_ARRAY_BUFFER, m_n_vectors_in_buffer_texture * m_n_vector_components * sizeof(glw::GLint), &data[0],
				  GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	m_tf_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	/* Setup transform feedback varyings */
	const char* varyings[] = { "outPosition" };
	gl.transformFeedbackVaryings(m_tf_po_id, 1, varyings, GL_SEPARATE_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error specifying transform feedback varyings!");

	m_tf_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating fragment shader object!");

	m_tf_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating vertex shader object!");

	std::string fsSource = getTFFragmentShaderCode();
	std::string vsSource = getTFVertexShaderCode();

	const char* fsCode = fsSource.c_str();
	const char* vsCode = vsSource.c_str();

	if (!buildProgram(m_tf_po_id, m_tf_fs_id, 1, &fsCode, m_tf_vs_id, 1, &vsCode))
	{
		TCU_FAIL("Could not create a program from valid vertex/fragment shader code!");
	}

	gl.useProgram(m_tf_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	m_position_location = gl.getAttribLocation(m_tf_po_id, "inPosition");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting attrib location!");

	gl.vertexAttribIPointer(m_position_location, m_n_vector_components, GL_INT, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting vertex attrib pointer!");

	gl.enableVertexAttribArray(m_position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error enabling vertex attrib array!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_tb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to transform feedback binding point!");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error starting transform feedback!");

	/* Render */
	gl.drawArrays(GL_POINTS, 0, m_n_vectors_in_buffer_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error during rendering!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ending transform feedback!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindVertexArray(0);

	if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		gl.disableVertexAttribArray(m_position_location);

	gl.useProgram(0);

	m_position_location = -1;
}